

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O0

space_type *
pico_tree::internal::
rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
rotate_space<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>>>
          (rotation_type *rotation,
          space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
          space)

{
  float **y_00;
  matrix_space<float,_784UL> *pmVar1;
  float **x_00;
  space_type *in_RDI;
  scalar_type *y;
  scalar_type *x;
  size_t i;
  space_type *s;
  rotation_type *in_stack_ffffffffffffff88;
  matrix_space<float,_784UL> *in_stack_ffffffffffffff90;
  matrix_space<float,_784UL> *this;
  rotation_type *rotation_00;
  matrix_space<float,_784UL> *local_28;
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  local_10 [2];
  
  y_00 = (float **)
         space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
         ::size((space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                 *)0x10e6bf);
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  ::sdim(local_10);
  matrix_space<float,_784UL>::matrix_space
            (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,0x10e6e0);
  local_28 = (matrix_space<float,_784UL> *)0x0;
  while (this = local_28,
        pmVar1 = (matrix_space<float,_784UL> *)
                 space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                 ::size((space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                         *)0x10e6fd), this < pmVar1) {
    in_stack_ffffffffffffff88 =
         (rotation_type *)
         space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
         ::operator[]<unsigned_long>
                   ((space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                     *)this,(unsigned_long)in_stack_ffffffffffffff88);
    rotation_00 = in_stack_ffffffffffffff88;
    x_00 = (float **)matrix_space<float,_784UL>::data(this,(size_type)in_stack_ffffffffffffff88);
    rotate_point<float_const*,float*>(rotation_00,x_00,y_00);
    local_28 = (matrix_space<float,_784UL> *)((long)&(local_28->storage_).size + 1);
  }
  return in_RDI;
}

Assistant:

static inline space_type rotate_space(
      rotation_type const& rotation, SpaceWrapper_ space) {
    space_type s(space.size(), space.sdim());

    for (std::size_t i = 0; i < space.size(); ++i) {
      auto x = space[i];
      auto y = s.data(i);
      rotate_point(rotation, x, y);
    }

    return s;
  }